

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

bool __thiscall cmsys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  char cVar1;
  long lVar2;
  ushort uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_t len;
  int flags;
  byte local_54 [4];
  RegExpCompile local_50;
  
  if (exp == (char *)0x0) {
    pcVar4 = "RegularExpression::compile(): No expression supplied.";
  }
  else {
    local_50.regnpar = 1;
    local_50.regcode = &regdummy;
    local_50.regsize = 1;
    local_50.regparse = exp;
    pcVar4 = RegExpCompile::reg(&local_50,0,(int *)local_54);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "RegularExpression::compile(): Error in compile.";
    }
    else {
      (this->regmatch).startp[0] = (char *)0x0;
      (this->regmatch).endp[0] = (char *)0x0;
      (this->regmatch).searchstring = (char *)0x0;
      if (local_50.regsize < 0xffff) {
        if (this->program != (char *)0x0) {
          operator_delete__(this->program);
        }
        lVar2 = local_50.regsize;
        pcVar4 = (char *)operator_new__(local_50.regsize);
        this->program = pcVar4;
        this->progsize = (int)lVar2;
        local_50.regnpar = 1;
        local_50.regcode = pcVar4 + 1;
        *pcVar4 = -100;
        local_50.regparse = exp;
        RegExpCompile::reg(&local_50,0,(int *)local_54);
        this->regstart = '\0';
        this->reganch = '\0';
        this->regmust = (char *)0x0;
        this->regmlen = 0;
        pcVar4 = this->program;
        uVar5 = (ulong)(ushort)(*(ushort *)(pcVar4 + 2) << 8 | *(ushort *)(pcVar4 + 2) >> 8);
        uVar7 = -uVar5;
        if (pcVar4[1] != '\a') {
          uVar7 = uVar5;
        }
        if (pcVar4[uVar7 + 1] != '\0') {
          return true;
        }
        if (pcVar4[4] == '\x01') {
          this->reganch = '\x01';
        }
        else if (pcVar4[4] == '\b') {
          this->regstart = pcVar4[7];
        }
        if ((local_54[0] & 4) == 0) {
          return true;
        }
        pcVar4 = pcVar4 + 4;
        uVar7 = 0;
        pcVar8 = (char *)0x0;
        do {
          cVar1 = *pcVar4;
          if (cVar1 == '\b') {
            sVar6 = strlen(pcVar4 + 3);
            if (uVar7 <= sVar6) {
              pcVar8 = pcVar4 + 3;
            }
            if (uVar7 < sVar6) {
              uVar7 = sVar6;
            }
          }
          if ((pcVar4 == &regdummy) ||
             (uVar3 = *(ushort *)(pcVar4 + 1) << 8 | *(ushort *)(pcVar4 + 1) >> 8, uVar3 == 0)) {
            pcVar4 = (char *)0x0;
          }
          else if (cVar1 == '\a') {
            pcVar4 = pcVar4 + -(ulong)uVar3;
          }
          else {
            pcVar4 = pcVar4 + uVar3;
          }
        } while (pcVar4 != (char *)0x0);
        this->regmust = pcVar8;
        this->regmlen = uVar7;
        return true;
      }
      pcVar4 = "RegularExpression::compile(): Expression too big.";
    }
  }
  puts(pcVar4);
  return false;
}

Assistant:

bool RegularExpression::compile(const char* exp)
{
  const char* scan;
  const char* longest;
  int flags;

  if (exp == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(No_Expr),
    printf("RegularExpression::compile(): No expression supplied.\n");
    return false;
  }

  // First pass: determine size, legality.
  RegExpCompile comp;
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regsize = 0L;
  comp.regcode = regdummyptr;
  comp.regc(static_cast<char>(MAGIC));
  if (!comp.reg(0, &flags)) {
    printf("RegularExpression::compile(): Error in compile.\n");
    return false;
  }
  this->regmatch.clear();

  // Small enough for pointer-storage convention?
  if (comp.regsize >= 65535L) {
    // RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
    printf("RegularExpression::compile(): Expression too big.\n");
    return false;
  }

  // Allocate space.
  // #ifndef _WIN32
  delete[] this->program;
  // #endif
  this->program = new char[comp.regsize];
  this->progsize = static_cast<int>(comp.regsize);

  if (this->program == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
    printf("RegularExpression::compile(): Out of memory.\n");
    return false;
  }

#ifdef __clang_analyzer__ /* Convince it that the program is initialized.  */
  memset(this->program, 0, comp.regsize);
#endif

  // Second pass: emit code.
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regcode = this->program;
  comp.regc(static_cast<char>(MAGIC));
  comp.reg(0, &flags);

  // Dig out information for optimizations.
  this->regstart = '\0'; // Worst-case defaults.
  this->reganch = 0;
  this->regmust = nullptr;
  this->regmlen = 0;
  scan = this->program + 1;       // First BRANCH.
  if (OP(regnext(scan)) == END) { // Only one top-level choice.
    scan = OPERAND(scan);

    // Starting-point info.
    if (OP(scan) == EXACTLY)
      this->regstart = *OPERAND(scan);
    else if (OP(scan) == BOL)
      this->reganch++;

    //
    // If there's something expensive in the r.e., find the longest
    // literal string that must appear and make it the regmust.  Resolve
    // ties in favor of later strings, since the regstart check works
    // with the beginning of the r.e. and avoiding duplication
    // strengthens checking.  Not a strong reason, but sufficient in the
    // absence of others.
    //
    if (flags & SPSTART) {
      longest = nullptr;
      size_t len = 0;
      for (; scan != nullptr; scan = regnext(scan))
        if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
          longest = OPERAND(scan);
          len = strlen(OPERAND(scan));
        }
      this->regmust = longest;
      this->regmlen = len;
    }
  }
  return true;
}